

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  ulong in_R8;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  if (s == end) {
    return (Result)Error;
  }
  pcVar2 = end;
  if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
    s = s + 2;
    if (s == end) {
      return (Result)Error;
    }
    if (s < end) {
      uVar1 = 0;
      do {
        iVar5 = (int)*s;
        bVar4 = false;
        uVar6 = uVar1;
        if (iVar5 != 0x5f) {
          bVar7 = true;
          if (iVar5 - 0x30U < 10) {
            in_R8 = (ulong)(iVar5 - 0x30U);
          }
          else if (iVar5 - 0x61U < 7) {
            in_R8 = (ulong)(iVar5 - 0x57);
          }
          else {
            bVar7 = iVar5 - 0x41U < 7;
            in_R8 = in_R8 & 0xffffffff;
            if (bVar7) {
              in_R8 = (ulong)(iVar5 - 0x37);
            }
          }
          bVar4 = true;
          if (bVar7) {
            uVar6 = in_R8 + uVar1 * 0x10;
            bVar4 = uVar6 < uVar1;
          }
        }
        if (bVar4) {
          return (Result)Error;
        }
        s = s + 1;
        uVar1 = uVar6;
      } while (s != end);
      goto LAB_00f5f98e;
    }
  }
  else if (s < end) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (*s != 0x5f) {
        uVar3 = (int)*s - 0x30;
        uVar6 = (ulong)uVar3 + uVar1 * 10;
        if (9 < uVar3) {
          return (Result)Error;
        }
        if (uVar6 < uVar1) {
          return (Result)Error;
        }
      }
      s = s + 1;
      uVar1 = uVar6;
    } while (s != end);
    goto LAB_00f5f98e;
  }
  uVar6 = 0;
  pcVar2 = s;
LAB_00f5f98e:
  if (pcVar2 == end) {
    *out = uVar6;
  }
  return (Result)(uint)(pcVar2 != end);
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      uint64_t old_value = value;
      value = value * 16 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  } else {
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      uint64_t old_value = value;
      value = value * 10 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}